

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_29d038f::HighBDConvolveScaleTest_DISABLED_Speed_Test::TestBody
          (HighBDConvolveScaleTest_DISABLED_Speed_Test *this)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  SEARCH_METHODS *message;
  int64_t ref_time;
  AssertionResult gtest_ar;
  int64_t tst_time;
  ACMRandom rnd;
  aom_usec_timer tst_timer;
  aom_usec_timer ref_timer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  AssertHelper local_98;
  long local_90;
  internal local_88 [8];
  undefined8 *local_80;
  long local_78;
  ACMRandom local_6c;
  timeval local_68;
  timeval local_58;
  timeval local_48;
  timeval local_38;
  
  local_6c.random_.state_ = (Random)0xbaba;
  ConvolveScaleTestBase<unsigned_short>::Prep
            ((ConvolveScaleTestBase<unsigned_short> *)this,&local_6c);
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  iVar3 = 1000;
  do {
    (*(this->super_HighBDConvolveScaleTest).super_ConvolveScaleTestBase<unsigned_short>.super_Test.
      _vptr_Test[6])(this);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  lVar2 = local_38.tv_usec - local_48.tv_usec;
  local_90 = lVar2 + 1000000;
  if (-1 < lVar2) {
    local_90 = lVar2;
  }
  local_90 = ((lVar2 >> 0x3f) + (local_38.tv_sec - local_48.tv_sec)) * 1000000 + local_90;
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  iVar3 = 1000;
  do {
    (*(this->super_HighBDConvolveScaleTest).super_ConvolveScaleTestBase<unsigned_short>.super_Test.
      _vptr_Test[6])(this);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  gettimeofday(&local_58,(__timezone_ptr_t)0x0);
  lVar2 = local_58.tv_usec - local_68.tv_usec;
  local_78 = lVar2 + 1000000;
  if (-1 < lVar2) {
    local_78 = lVar2;
  }
  local_78 = ((lVar2 >> 0x3f) + (local_58.tv_sec - local_68.tv_sec)) * 1000000 + local_78;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[          ] C time = ",0x16);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms, SIMD time = ",0x11);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms\n",4);
  testing::internal::CmpHelperGT<long,long>(local_88,"ref_time","tst_time",&local_90,&local_78);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0._M_head_impl + 0x10),
               "Error: CDEFSpeedTest, SIMD slower than C.\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0._M_head_impl + 0x10),"C time: ",8);
    std::ostream::_M_insert<long>((long)(local_a0._M_head_impl + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0._M_head_impl + 0x10)," us\n",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0._M_head_impl + 0x10),"SIMD time: ",0xb);
    std::ostream::_M_insert<long>((long)(local_a0._M_head_impl + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0._M_head_impl + 0x10)," us\n",4);
    if (local_80 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_scale_test.cc"
               ,0x120,(char *)message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(local_80);
  }
  return;
}

Assistant:

TEST_P(HighBDConvolveScaleTest, DISABLED_Speed) { SpeedTest(); }